

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

AdjustResult __thiscall
QTextCursorPrivate::adjustPosition
          (QTextCursorPrivate *this,int positionOfChange,int charsAddedOrRemoved,Operation op)

{
  AdjustResult result;
  Operation op_local;
  int charsAddedOrRemoved_local;
  int positionOfChange_local;
  QTextCursorPrivate *this_local;
  
  result = CursorMoved;
  if ((this->position < positionOfChange) ||
     ((this->position == positionOfChange &&
      ((op == KeepCursor || (((byte)this->field_0x28 >> 1 & 1) != 0)))))) {
    result = CursorUnchanged;
  }
  else {
    if ((charsAddedOrRemoved < 0) && (this->position < positionOfChange - charsAddedOrRemoved)) {
      this->position = positionOfChange;
    }
    else {
      this->position = charsAddedOrRemoved + this->position;
    }
    this->currentCharFormat = -1;
  }
  if ((positionOfChange <= this->anchor) &&
     ((this->anchor != positionOfChange || (op != KeepCursor)))) {
    if ((charsAddedOrRemoved < 0) && (this->anchor < positionOfChange - charsAddedOrRemoved)) {
      this->anchor = positionOfChange;
    }
    else {
      this->anchor = charsAddedOrRemoved + this->anchor;
    }
  }
  if ((positionOfChange <= this->adjusted_anchor) &&
     ((this->adjusted_anchor != positionOfChange || (op != KeepCursor)))) {
    if ((charsAddedOrRemoved < 0) &&
       (this->adjusted_anchor < positionOfChange - charsAddedOrRemoved)) {
      this->adjusted_anchor = positionOfChange;
    }
    else {
      this->adjusted_anchor = charsAddedOrRemoved + this->adjusted_anchor;
    }
  }
  return result;
}

Assistant:

QTextCursorPrivate::AdjustResult QTextCursorPrivate::adjustPosition(int positionOfChange, int charsAddedOrRemoved, QTextUndoCommand::Operation op)
{
    QTextCursorPrivate::AdjustResult result = QTextCursorPrivate::CursorMoved;
    // not(!) <= , so that inserting text adjusts the cursor correctly
    if (position < positionOfChange
        || (position == positionOfChange
            && (op == QTextUndoCommand::KeepCursor
                || keepPositionOnInsert)
            )
         ) {
        result = CursorUnchanged;
    } else {
        if (charsAddedOrRemoved < 0 && position < positionOfChange - charsAddedOrRemoved)
            position = positionOfChange;
        else
            position += charsAddedOrRemoved;

        currentCharFormat = -1;
    }

    if (anchor >= positionOfChange
        && (anchor != positionOfChange || op != QTextUndoCommand::KeepCursor)) {
        if (charsAddedOrRemoved < 0 && anchor < positionOfChange - charsAddedOrRemoved)
            anchor = positionOfChange;
        else
            anchor += charsAddedOrRemoved;
    }

    if (adjusted_anchor >= positionOfChange
        && (adjusted_anchor != positionOfChange || op != QTextUndoCommand::KeepCursor)) {
        if (charsAddedOrRemoved < 0 && adjusted_anchor < positionOfChange - charsAddedOrRemoved)
            adjusted_anchor = positionOfChange;
        else
            adjusted_anchor += charsAddedOrRemoved;
    }

    return result;
}